

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::convert_number_to_string_special(double value)

{
  double v;
  double value_local;
  
  if ((value != 0.0) || (NAN(value))) {
    if (NAN(value)) {
      value_local = (double)anon_var_dwarf_d07e;
    }
    else if ((value * 2.0 != value) || (NAN(value * 2.0) || NAN(value))) {
      value_local = 0.0;
    }
    else {
      value_local = (double)"-Infinity";
      if (0.0 < value) {
        value_local = 6.1506331063906e-318;
      }
    }
  }
  else {
    value_local = (double)((long)"!dest && (header & header_mask) == 0" + 0x23);
  }
  return (char_t *)value_local;
}

Assistant:

PUGI__FN const char_t* convert_number_to_string_special(double value)
	{
	#if defined(PUGI__MSVC_CRT_VERSION) || defined(__BORLANDC__)
		if (_finite(value)) return (value == 0) ? PUGIXML_TEXT("0") : 0;
		if (_isnan(value)) return PUGIXML_TEXT("NaN");
		return value > 0 ? PUGIXML_TEXT("Infinity") : PUGIXML_TEXT("-Infinity");
	#elif defined(fpclassify) && defined(FP_NAN) && defined(FP_INFINITE) && defined(FP_ZERO)
		switch (fpclassify(value))
		{
		case FP_NAN:
			return PUGIXML_TEXT("NaN");

		case FP_INFINITE:
			return value > 0 ? PUGIXML_TEXT("Infinity") : PUGIXML_TEXT("-Infinity");

		case FP_ZERO:
			return PUGIXML_TEXT("0");

		default:
			return 0;
		}
	#else
		// fallback
		const volatile double v = value;

		if (v == 0) return PUGIXML_TEXT("0");
		if (v != v) return PUGIXML_TEXT("NaN");
		if (v * 2 == v) return value > 0 ? PUGIXML_TEXT("Infinity") : PUGIXML_TEXT("-Infinity");
		return 0;
	#endif
	}